

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O2

_Bool ValidateMagic(uint8_t *region,uint8_t *expected_magic,size_t magic_len)

{
  int i;
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if (magic_len == uVar1) {
LAB_00106a01:
      return magic_len <= uVar1;
    }
    if (region[uVar1] != expected_magic[uVar1]) {
      LPDebug("","(%s) %d != %d","ValidateMagic");
      goto LAB_00106a01;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

bool
ValidateMagic(uint8_t *region, const uint8_t *expected_magic, const size_t magic_len)
{
	uint8_t *regionptr = region;

	for (int i = 0; i < magic_len; i++) {
		if (*regionptr == expected_magic[i]) {
			regionptr++;
		} else {
			LPDebug("", "(%s) %d != %d", __func__, *regionptr, expected_magic[i]);
			return false;
		}
	}

	return true;
}